

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::mapTag(Input *this,StringRef Tag,bool Default)

{
  ulong uVar1;
  StringRef local_68;
  undefined4 local_54;
  undefined1 local_50 [8];
  string foundTag;
  bool Default_local;
  Input *this_local;
  StringRef Tag_local;
  
  Tag_local.Data = (char *)Tag.Length;
  this_local = (Input *)Tag.Data;
  if (this->CurrentNode == (HNode *)0x0) {
    Tag_local.Length._7_1_ = 0;
  }
  else {
    foundTag.field_2._M_local_buf[0xf] = Default;
    Node::getVerbatimTag_abi_cxx11_((string *)local_50,this->CurrentNode->_node);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      StringRef::StringRef(&local_68,(string *)local_50);
      Tag_local.Length._7_1_ = StringRef::equals((StringRef *)&this_local,local_68);
    }
    else {
      Tag_local.Length._7_1_ = foundTag.field_2._M_local_buf[0xf] & 1;
    }
    local_54 = 1;
    std::__cxx11::string::~string((string *)local_50);
  }
  return (bool)(Tag_local.Length._7_1_ & 1);
}

Assistant:

bool Input::mapTag(StringRef Tag, bool Default) {
  // CurrentNode can be null if setCurrentDocument() was unable to
  // parse the document because it was invalid or empty.
  if (!CurrentNode)
    return false;

  std::string foundTag = CurrentNode->_node->getVerbatimTag();
  if (foundTag.empty()) {
    // If no tag found and 'Tag' is the default, say it was found.
    return Default;
  }
  // Return true iff found tag matches supplied tag.
  return Tag.equals(foundTag);
}